

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  char *pcVar1;
  ulong *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  byte bVar6;
  undefined1 auVar7 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  char *pcVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  uint uVar17;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined8 local_58;
  char *local_50;
  bool *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  ulong local_38;
  
  local_48 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = lsel->sel_vector;
      psVar4 = rsel->sel_vector;
      uVar14 = 0;
      do {
        uVar11 = uVar14;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[uVar14];
        }
        uVar13 = uVar14;
        if (psVar4 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar4[uVar14];
        }
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar11].value.pointer.ptr
        ;
        local_58 = *(idx_t *)&rdata[uVar13].value;
        local_50 = rdata[uVar13].value.pointer.ptr;
        uVar17 = (uint)*(ulong *)&ldata[uVar11].value;
        if ((uint)local_58 <= uVar17) {
          uVar13 = local_58 & 0xffffffff;
          if (uVar17 < 0xd) {
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
          }
          pcVar9 = local_50 + -1;
          if ((uint)local_58 < 0xd) {
            pcVar9 = (char *)((long)&local_58 + 3);
          }
          pcVar15 = (char *)((long)p_Stack_60 + (*(ulong *)&ldata[uVar11].value & 0xffffffff));
          do {
            pcVar15 = pcVar15 + -1;
            bVar16 = (int)uVar13 < 1;
            if ((int)uVar13 < 1) goto LAB_01136331;
            pcVar1 = pcVar9 + uVar13;
            uVar13 = uVar13 - 1;
          } while (*pcVar1 == *pcVar15);
        }
        bVar16 = false;
LAB_01136331:
        result_data[uVar14] = bVar16;
        uVar14 = uVar14 + 1;
      } while (uVar14 != count);
    }
  }
  else if (count != 0) {
    psVar3 = lsel->sel_vector;
    psVar4 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar14 = 0;
    local_38 = count;
    do {
      uVar11 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar14];
      }
      uVar13 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar4[uVar14];
      }
      puVar5 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
         && ((puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))
         ) {
        local_68 = *(undefined1 (*) [8])&ldata[uVar11].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar11].value.pointer.ptr
        ;
        local_58 = *(idx_t *)&rdata[uVar13].value;
        local_50 = rdata[uVar13].value.pointer.ptr;
        if ((uint)local_58 <= SUB84(local_68,0)) {
          uVar11 = local_58 & 0xffffffff;
          p_Var12 = p_Stack_60;
          if (SUB84(local_68,0) < 0xd) {
            p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
          }
          pcVar9 = local_50 + -1;
          if ((uint)local_58 < 0xd) {
            pcVar9 = (char *)((long)&local_58 + 3);
          }
          pcVar15 = (char *)((long)&p_Var12->_vptr__Sp_counted_base + ((ulong)local_68 & 0xffffffff)
                            );
          do {
            pcVar15 = pcVar15 + -1;
            bVar16 = (int)uVar11 < 1;
            if ((int)uVar11 < 1) goto LAB_01136434;
            pcVar1 = pcVar9 + uVar11;
            uVar11 = uVar11 - 1;
          } while (*pcVar1 == *pcVar15);
        }
        bVar16 = false;
LAB_01136434:
        local_48[uVar14] = bVar16;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_68,&local_58);
          p_Var8 = p_Stack_60;
          auVar7 = local_68;
          local_68 = (undefined1  [8])0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var12 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar7;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var8;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          count = local_38;
        }
        bVar6 = (byte)uVar14 & 0x3f;
        puVar2 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar14 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != count);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}